

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O1

Query * __thiscall
Query::plan(Query *__return_storage_ptr__,Query *this,
           unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
           *types_to_query)

{
  uint32_t uVar1;
  pointer pQVar2;
  pointer this_00;
  vector<Query,_std::allocator<Query>_> local_98;
  Query *local_80;
  Query local_78;
  
  if (this->type == PRIMITIVE) {
    plan_qstring(__return_storage_ptr__,types_to_query,&this->value);
  }
  else {
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    this_00 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
              super__Vector_impl_data._M_start;
    pQVar2 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_80 = this;
    if (this_00 != pQVar2) {
      do {
        plan(&local_78,this_00,types_to_query);
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_98,&local_78);
        std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
        std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
        this_00 = this_00 + 1;
      } while (this_00 != pQVar2);
    }
    if (local_80->type == MIN_OF) {
      uVar1 = local_80->count;
      __return_storage_ptr__->type = MIN_OF;
      (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->ngram).itype = GRAM3;
      (__return_storage_ptr__->ngram).trigram = 0;
      __return_storage_ptr__->count = uVar1;
    }
    else {
      __return_storage_ptr__->type = local_80->type;
      (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->ngram).itype = GRAM3;
      (__return_storage_ptr__->ngram).trigram = 0;
      __return_storage_ptr__->count = 0;
    }
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<Query,_std::allocator<Query>_>::~vector(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

Query Query::plan(const std::unordered_set<IndexType> &types_to_query) const {
    if (type != QueryType::PRIMITIVE) {
        std::vector<Query> plans;
        for (const auto &query : queries) {
            plans.emplace_back(query.plan(types_to_query));
        }
        if (type == QueryType::MIN_OF) {
            return Query(count, std::move(plans));
        }
        return Query(type, std::move(plans));
    }

    return plan_qstring(types_to_query, value);
}